

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  uint uVar1;
  TargetType type_00;
  allocator local_49;
  string local_48;
  
  uVar1 = type - STATIC_LIBRARY;
  if ((uVar1 < 7) && ((0x4fU >> (uVar1 & 0x1f) & 1) != 0)) {
    type_00 = *(TargetType *)(&DAT_0047b2c4 + (ulong)uVar1 * 4);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_48,"cmMakefile::AddLibrary given invalid target type.",&local_49);
    IssueMessage(this,INTERNAL_ERROR,&local_48,false);
    std::__cxx11::string::~string((string *)&local_48);
    type_00 = STATIC_LIBRARY;
  }
  this_00 = AddNewTarget(this,type_00,lname);
  cmTarget::ClearDependencyInformation(this_00,this,lname);
  if (excludeFromAll) {
    std::__cxx11::string::string((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    cmTarget::SetProperty(this_00,&local_48,"TRUE");
    std::__cxx11::string::~string((string *)&local_48);
  }
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,lname,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                            cmState::TargetType type,
                            const std::vector<std::string> &srcs,
                            bool excludeFromAll)
{
  // wrong type ? default to STATIC
  if (    (type != cmState::STATIC_LIBRARY)
       && (type != cmState::SHARED_LIBRARY)
       && (type != cmState::MODULE_LIBRARY)
       && (type != cmState::OBJECT_LIBRARY)
       && (type != cmState::INTERFACE_LIBRARY))
    {
    this->IssueMessage(cmake::INTERNAL_ERROR,
                       "cmMakefile::AddLibrary given invalid target type.");
    type = cmState::STATIC_LIBRARY;
    }

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation( *this, lname );
  if(excludeFromAll)
    {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(lname, *target);
  return target;
}